

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345
          (MDLImporter *this,aiVector3D *vOut,TexCoord_MDL3 *pcSrc,uint iIndex)

{
  uchar *puVar1;
  Logger *this_00;
  float local_38;
  float local_34;
  float t;
  float s;
  Header *pcHeader;
  uint iIndex_local;
  TexCoord_MDL3 *pcSrc_local;
  aiVector3D *vOut_local;
  MDLImporter *this_local;
  
  if (pcSrc != (TexCoord_MDL3 *)0x0) {
    puVar1 = this->mBuffer;
    pcHeader._4_4_ = iIndex;
    if (*(uint *)(puVar1 + 0x48) <= iIndex) {
      pcHeader._4_4_ = *(int *)(puVar1 + 0x48) - 1;
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Index overflow in MDLn UV coord list");
    }
    local_34 = (float)(int)pcSrc[pcHeader._4_4_].u;
    local_38 = (float)(int)pcSrc[pcHeader._4_4_].v;
    if (this->iGSFileVersion != 5) {
      local_34 = (local_34 + 0.5) / (float)*(int *)(puVar1 + 0x34);
      local_38 = 1.0 - (local_38 + 0.5) / (float)*(int *)(puVar1 + 0x38);
    }
    vOut->x = local_34;
    vOut->y = local_38;
    vOut->z = 0.0;
    return;
  }
  __assert_fail("__null != pcSrc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x314,
                "void Assimp::MDLImporter::ImportUVCoordinate_3DGS_MDL345(aiVector3D &, const MDL::TexCoord_MDL3 *, unsigned int)"
               );
}

Assistant:

void MDLImporter::ImportUVCoordinate_3DGS_MDL345(
    aiVector3D& vOut,
    const MDL::TexCoord_MDL3* pcSrc,
    unsigned int iIndex)
{
    ai_assert(NULL != pcSrc);
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // validate UV indices
    if (iIndex >= (unsigned int) pcHeader->synctype)    {
        iIndex = pcHeader->synctype-1;
        ASSIMP_LOG_WARN("Index overflow in MDLn UV coord list");
    }

    float s = (float)pcSrc[iIndex].u;
    float t = (float)pcSrc[iIndex].v;

    // Scale s and t to range from 0.0 to 1.0
    if (0x5 != iGSFileVersion)  {
        s = (s + 0.5f)      / pcHeader->skinwidth;
        t = 1.0f-(t + 0.5f) / pcHeader->skinheight;
    }

    vOut.x = s;
    vOut.y = t;
    vOut.z = 0.0f;
}